

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O3

void DrawRing(Vector2 center,float innerRadius,float outerRadius,float startAngle,float endAngle,
             int segments,Color color)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float radius;
  float local_6c;
  float local_58;
  float fStack_54;
  
  if ((startAngle == endAngle) && (!NAN(startAngle) && !NAN(endAngle))) {
    return;
  }
  radius = (float)(~-(uint)(outerRadius < innerRadius) & (uint)outerRadius |
                  (~-(uint)(0.0 < innerRadius) & 0x3dcccccd |
                  -(uint)(0.0 < innerRadius) & (uint)innerRadius) &
                  -(uint)(outerRadius < innerRadius));
  if (innerRadius <= outerRadius) {
    outerRadius = innerRadius;
  }
  local_6c = endAngle;
  if (startAngle <= endAngle) {
    local_6c = startAngle;
    startAngle = endAngle;
  }
  fVar2 = startAngle - local_6c;
  fVar3 = ceilf(fVar2 / 90.0);
  if (segments < (int)fVar3) {
    fVar4 = -0.5 / radius + 1.0;
    fVar4 = fVar4 * fVar4;
    fVar4 = acosf(fVar4 + fVar4 + -1.0);
    fVar4 = ceilf(6.2831855 / fVar4);
    iVar1 = (int)((fVar4 * fVar2) / 360.0);
    segments = (int)fVar3;
    if (0 < iVar1) {
      segments = iVar1;
    }
  }
  if (0.0 < outerRadius) {
    rlCheckRenderBatchLimit(segments * 4);
    rlSetTexture(texShapes.id);
    rlBegin(7);
    if (0 < segments) {
      fVar3 = (float)segments;
      fStack_54 = center.y;
      do {
        rlColor4ub(color.r,color.g,color.b,color.a);
        rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                     texShapesRec.y / (float)texShapes.height);
        fVar6 = local_6c * 0.017453292;
        fVar4 = sinf(fVar6);
        local_58 = center.x;
        fVar5 = cosf(fVar6);
        rlVertex2f(fVar4 * outerRadius + local_58,fVar5 * outerRadius + fStack_54);
        rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                     (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
        fVar4 = sinf(fVar6);
        fVar5 = cosf(fVar6);
        rlVertex2f(fVar4 * radius + local_58,fVar5 * radius + fStack_54);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                     (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
        local_6c = local_6c + fVar2 / fVar3;
        fVar4 = local_6c * 0.017453292;
        fVar5 = sinf(fVar4);
        fVar6 = cosf(fVar4);
        rlVertex2f(fVar5 * radius + local_58,fVar6 * radius + fStack_54);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                     texShapesRec.y / (float)texShapes.height);
        fVar5 = sinf(fVar4);
        fVar4 = cosf(fVar4);
        rlVertex2f(fVar5 * outerRadius + local_58,fVar4 * outerRadius + fStack_54);
        segments = segments + -1;
      } while (segments != 0);
    }
    rlEnd();
    rlSetTexture(0);
    return;
  }
  DrawCircleSector(center,radius,local_6c,startAngle,segments,color);
  return;
}

Assistant:

void DrawRing(Vector2 center, float innerRadius, float outerRadius, float startAngle, float endAngle, int segments, Color color)
{
    if (startAngle == endAngle) return;

    // Function expects (outerRadius > innerRadius)
    if (outerRadius < innerRadius)
    {
        float tmp = outerRadius;
        outerRadius = innerRadius;
        innerRadius = tmp;

        if (outerRadius <= 0.0f) outerRadius = 0.1f;
    }

    // Function expects (endAngle > startAngle)
    if (endAngle < startAngle)
    {
        // Swap values
        float tmp = startAngle;
        startAngle = endAngle;
        endAngle = tmp;
    }

    int minSegments = (int)ceilf((endAngle - startAngle)/90);

    if (segments < minSegments)
    {
        // Calculate the maximum angle between segments based on the error rate (usually 0.5f)
        float th = acosf(2*powf(1 - SMOOTH_CIRCLE_ERROR_RATE/outerRadius, 2) - 1);
        segments = (int)((endAngle - startAngle)*ceilf(2*PI/th)/360);

        if (segments <= 0) segments = minSegments;
    }

    // Not a ring
    if (innerRadius <= 0.0f)
    {
        DrawCircleSector(center, outerRadius, startAngle, endAngle, segments, color);
        return;
    }

    float stepLength = (endAngle - startAngle)/(float)segments;
    float angle = startAngle;

#if defined(SUPPORT_QUADS_DRAW_MODE)
    rlCheckRenderBatchLimit(4*segments);

    rlSetTexture(texShapes.id);

    rlBegin(RL_QUADS);
        for (int i = 0; i < segments; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*angle)*innerRadius, center.y + cosf(DEG2RAD*angle)*innerRadius);

            rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*angle)*outerRadius, center.y + cosf(DEG2RAD*angle)*outerRadius);

            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*outerRadius, center.y + cosf(DEG2RAD*(angle + stepLength))*outerRadius);

            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + cosf(DEG2RAD*(angle + stepLength))*innerRadius);

            angle += stepLength;
        }
    rlEnd();

    rlSetTexture(0);
#else
    rlCheckRenderBatchLimit(6*segments);

    rlBegin(RL_TRIANGLES);
        for (int i = 0; i < segments; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlVertex2f(center.x + sinf(DEG2RAD*angle)*innerRadius, center.y + cosf(DEG2RAD*angle)*innerRadius);
            rlVertex2f(center.x + sinf(DEG2RAD*angle)*outerRadius, center.y + cosf(DEG2RAD*angle)*outerRadius);
            rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + cosf(DEG2RAD*(angle + stepLength))*innerRadius);

            rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + cosf(DEG2RAD*(angle + stepLength))*innerRadius);
            rlVertex2f(center.x + sinf(DEG2RAD*angle)*outerRadius, center.y + cosf(DEG2RAD*angle)*outerRadius);
            rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*outerRadius, center.y + cosf(DEG2RAD*(angle + stepLength))*outerRadius);

            angle += stepLength;
        }
    rlEnd();
#endif
}